

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void call_internal_bif(char *nm,int err,int argc)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  size_t len;
  CTcSymbol *pCVar1;
  
  len = strlen(nm);
  pCVar1 = CTcPrsSymtab::find(G_prs->global_symtab_,nm,len,(CTcPrsSymtab **)0x0);
  if (pCVar1 != (CTcSymbol *)0x0) {
    UNRECOVERED_JUMPTABLE =
         (pCVar1->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
         [0x1b];
    (*UNRECOVERED_JUMPTABLE)(pCVar1,0,(ulong)(uint)argc,0,0,UNRECOVERED_JUMPTABLE);
    return;
  }
  CTcTokenizer::log_error(err,len & 0xffffffff,nm);
  return;
}

Assistant:

static void call_internal_bif(const char *nm, int err, int argc)
{
    /* look up the function */
    CTcSymBif *fn = get_internal_bif(nm, err);

    /* if we got it, call it */
    if (fn != 0)
        fn->gen_code_call(FALSE, argc, FALSE, 0);
}